

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_lha.c
# Opt level: O0

wchar_t lha_read_file_header_3(archive_read *a,lha *lha)

{
  uint16_t uVar1;
  uint32_t uVar2;
  uint16_t local_36;
  wchar_t local_34;
  uint16_t header_crc;
  wchar_t err;
  size_t extdsize;
  uchar *p;
  lha *lha_local;
  archive_read *a_local;
  
  p = (uchar *)lha;
  lha_local = (lha *)a;
  extdsize = (size_t)__archive_read_ahead(a,0x1c,(ssize_t *)0x0);
  if ((void *)extdsize == (void *)0x0) {
    a_local._4_4_ = truncated_error((archive_read *)lha_local);
  }
  else {
    uVar1 = archive_le16dec((void *)extdsize);
    if (uVar1 == 4) {
      uVar2 = archive_le32dec((void *)(extdsize + 0x18));
      *(ulong *)(p + 0x20) = (ulong)uVar2;
      uVar2 = archive_le32dec((void *)(extdsize + 7));
      *(ulong *)(p + 0x30) = (ulong)uVar2;
      uVar2 = archive_le32dec((void *)(extdsize + 0xb));
      *(ulong *)(p + 0x38) = (ulong)uVar2;
      uVar2 = archive_le32dec((void *)(extdsize + 0xf));
      *(ulong *)(p + 0x58) = (ulong)uVar2;
      uVar1 = archive_le16dec((void *)(extdsize + 0x15));
      *(uint16_t *)(p + 0xba) = uVar1;
      *(uint *)(p + 0x40) = *(uint *)(p + 0x40) | 8;
      if (0x1f < *(ulong *)(p + 0x20)) {
        local_36 = lha_crc16(0,(void *)extdsize,0x1c);
        __archive_read_consume((archive_read *)lha_local,0x1c);
        local_34 = lha_read_file_extended_header
                             ((archive_read *)lha_local,(lha *)p,&local_36,L'\x04',
                              *(long *)(p + 0x20) - 0x1c,(size_t *)&stack0xffffffffffffffd0);
        if (local_34 < L'\xffffffec') {
          return local_34;
        }
        if (local_36 == *(uint16_t *)(p + 0xb8)) {
          return local_34;
        }
        archive_set_error((archive *)lha_local,0x54,"LHa header CRC error");
        return L'\xffffffe2';
      }
    }
    archive_set_error((archive *)lha_local,0x54,"Invalid LHa header");
    a_local._4_4_ = L'\xffffffe2';
  }
  return a_local._4_4_;
}

Assistant:

static int
lha_read_file_header_3(struct archive_read *a, struct lha *lha)
{
	const unsigned char *p;
	size_t extdsize;
	int err;
	uint16_t header_crc;

	if ((p = __archive_read_ahead(a, H3_FIXED_SIZE, NULL)) == NULL)
		return (truncated_error(a));

	if (archive_le16dec(p + H3_FIELD_LEN_OFFSET) != 4)
		goto invalid;
	lha->header_size = archive_le32dec(p + H3_HEADER_SIZE_OFFSET);
	lha->compsize = archive_le32dec(p + H3_COMP_SIZE_OFFSET);
	lha->origsize = archive_le32dec(p + H3_ORIG_SIZE_OFFSET);
	lha->mtime = archive_le32dec(p + H3_TIME_OFFSET);
	lha->crc = archive_le16dec(p + H3_CRC_OFFSET);
	lha->setflag |= CRC_IS_SET;

	if (lha->header_size < H3_FIXED_SIZE + 4)
		goto invalid;
	header_crc = lha_crc16(0, p, H3_FIXED_SIZE);
	__archive_read_consume(a, H3_FIXED_SIZE);

	/* Read extended headers */
	err = lha_read_file_extended_header(a, lha, &header_crc, 4,
		  lha->header_size - H3_FIXED_SIZE, &extdsize);
	if (err < ARCHIVE_WARN)
		return (err);

	if (header_crc != lha->header_crc) {
#ifndef DONT_FAIL_ON_CRC_ERROR
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "LHa header CRC error");
		return (ARCHIVE_FATAL);
#endif
	}
	return (err);
invalid:
	archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
	    "Invalid LHa header");
	return (ARCHIVE_FATAL);
}